

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O1

int SSL_use_RSAPrivateKey_ASN1(SSL *ssl,uchar *d,long len)

{
  int iVar1;
  UniquePtr<RSA> rsa;
  unique_ptr<rsa_st,_bssl::internal::Deleter> local_10;
  
  local_10._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_rsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true>)
                 RSA_private_key_from_bytes(d,len);
  if (local_10._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>)0x0) {
    iVar1 = 0;
    ERR_put_error(0x10,0,0xc,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0x158);
  }
  else {
    iVar1 = SSL_use_RSAPrivateKey
                      (ssl,(RSA *)local_10._M_t.
                                  super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl);
  }
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_10);
  return iVar1;
}

Assistant:

int SSL_use_RSAPrivateKey_ASN1(SSL *ssl, const uint8_t *der, size_t der_len) {
  UniquePtr<RSA> rsa(RSA_private_key_from_bytes(der, der_len));
  if (!rsa) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_ASN1_LIB);
    return 0;
  }

  return SSL_use_RSAPrivateKey(ssl, rsa.get());
}